

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_base.cpp
# Opt level: O2

ssize_t __thiscall
zmq::socket_base_t::send(socket_base_t *this,int __fd,void *__buf,size_t __n,int __flags)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int *piVar5;
  uint64_t uVar6;
  char *pcVar7;
  undefined4 in_register_00000034;
  EVP_PKEY_CTX *this_00;
  mutex_t *mutex_;
  EVP_PKEY_CTX *ctx;
  int iVar8;
  ulong uVar9;
  scoped_optional_lock_t sync_lock;
  
  this_00 = (EVP_PKEY_CTX *)CONCAT44(in_register_00000034,__fd);
  mutex_ = (mutex_t *)0x0;
  if (this->_thread_safe != false) {
    mutex_ = &this->_sync;
  }
  scoped_optional_lock_t::scoped_optional_lock_t(&sync_lock,mutex_);
  if (this->_ctx_terminated == true) {
    piVar5 = __errno_location();
    *piVar5 = 0x9523dfd;
  }
  else if ((this_00 == (EVP_PKEY_CTX *)0x0) || (bVar1 = msg_t::check((msg_t *)this_00), !bVar1)) {
    piVar5 = __errno_location();
    *piVar5 = 0xe;
  }
  else {
    iVar2 = process_commands(this,0,true);
    if (iVar2 == 0) {
      msg_t::reset_flags((msg_t *)this_00,'\x01');
      if (((ulong)__buf & 2) != 0) {
        msg_t::set_flags((msg_t *)this_00,'\x01');
      }
      msg_t::reset_metadata((msg_t *)this_00);
      ctx = this_00;
      uVar3 = (*(this->super_own_t).super_object_t._vptr_object_t[0x23])(this);
      uVar9 = (ulong)uVar3;
      if (uVar3 == 0) goto LAB_001b1f80;
      if (((uVar3 == 0xfffffffe) && (((ulong)__buf & 1) == 0)) &&
         ((this->super_own_t).options.sndtimeo != 0)) {
        iVar2 = msg_t::close((msg_t *)this_00,(int)ctx);
        if (iVar2 != 0) {
          piVar5 = __errno_location();
          pcVar7 = strerror(*piVar5);
          ctx = (EVP_PKEY_CTX *)0x1dfbd5;
          fprintf(_stderr,"%s (%s:%d)\n",pcVar7,
                  "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/socket_base.cpp"
                  ,0x4f5);
          fflush(_stderr);
          zmq_abort(pcVar7);
        }
        iVar2 = msg_t::init((msg_t *)this_00,ctx);
        if (iVar2 == 0) {
LAB_001b1f7d:
          uVar9 = 0;
        }
        else {
          piVar5 = __errno_location();
          pcVar7 = strerror(*piVar5);
          uVar9 = 0;
          fprintf(_stderr,"%s (%s:%d)\n",pcVar7,
                  "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/socket_base.cpp"
                  ,0x4f7);
          fflush(_stderr);
          zmq_abort(pcVar7);
        }
        goto LAB_001b1f80;
      }
      piVar5 = __errno_location();
      if (((((ulong)__buf & 1) == 0) && (*piVar5 == 0xb)) &&
         (iVar2 = (this->super_own_t).options.sndtimeo, iVar2 != 0)) {
        if (iVar2 < 0) {
          iVar8 = 0;
        }
        else {
          uVar6 = clock_t::now_ms(&this->_clock);
          iVar8 = (int)uVar6 + iVar2;
        }
        do {
          do {
            iVar4 = process_commands(this,iVar2,false);
            if (iVar4 != 0) goto LAB_001b1f23;
            iVar4 = (*(this->super_own_t).super_object_t._vptr_object_t[0x23])(this,this_00);
            if (iVar4 == 0) goto LAB_001b1f7d;
            if (*piVar5 != 0xb) goto LAB_001b1f23;
          } while (iVar2 < 1);
          uVar6 = clock_t::now_ms(&this->_clock);
          iVar2 = iVar8 - (int)uVar6;
        } while (0 < iVar2);
        *piVar5 = 0xb;
LAB_001b1f23:
        uVar9 = 0xffffffffffffffff;
        goto LAB_001b1f80;
      }
    }
  }
  uVar9 = 0xffffffff;
LAB_001b1f80:
  scoped_optional_lock_t::~scoped_optional_lock_t(&sync_lock);
  return uVar9 & 0xffffffff;
}

Assistant:

int zmq::socket_base_t::send (msg_t *msg_, int flags_)
{
    scoped_optional_lock_t sync_lock (_thread_safe ? &_sync : NULL);

    //  Check whether the context hasn't been shut down yet.
    if (unlikely (_ctx_terminated)) {
        errno = ETERM;
        return -1;
    }

    //  Check whether message passed to the function is valid.
    if (unlikely (!msg_ || !msg_->check ())) {
        errno = EFAULT;
        return -1;
    }

    //  Process pending commands, if any.
    int rc = process_commands (0, true);
    if (unlikely (rc != 0)) {
        return -1;
    }

    //  Clear any user-visible flags that are set on the message.
    msg_->reset_flags (msg_t::more);

    //  At this point we impose the flags on the message.
    if (flags_ & ZMQ_SNDMORE)
        msg_->set_flags (msg_t::more);

    msg_->reset_metadata ();

    //  Try to send the message using method in each socket class
    rc = xsend (msg_);
    if (rc == 0) {
        return 0;
    }
    //  Special case for ZMQ_PUSH: -2 means pipe is dead while a
    //  multi-part send is in progress and can't be recovered, so drop
    //  silently when in blocking mode to keep backward compatibility.
    if (unlikely (rc == -2)) {
        if (!((flags_ & ZMQ_DONTWAIT) || options.sndtimeo == 0)) {
            rc = msg_->close ();
            errno_assert (rc == 0);
            rc = msg_->init ();
            errno_assert (rc == 0);
            return 0;
        }
    }
    if (unlikely (errno != EAGAIN)) {
        return -1;
    }

    //  In case of non-blocking send we'll simply propagate
    //  the error - including EAGAIN - up the stack.
    if ((flags_ & ZMQ_DONTWAIT) || options.sndtimeo == 0) {
        return -1;
    }

    //  Compute the time when the timeout should occur.
    //  If the timeout is infinite, don't care.
    int timeout = options.sndtimeo;
    const uint64_t end = timeout < 0 ? 0 : (_clock.now_ms () + timeout);

    //  Oops, we couldn't send the message. Wait for the next
    //  command, process it and try to send the message again.
    //  If timeout is reached in the meantime, return EAGAIN.
    while (true) {
        if (unlikely (process_commands (timeout, false) != 0)) {
            return -1;
        }
        rc = xsend (msg_);
        if (rc == 0)
            break;
        if (unlikely (errno != EAGAIN)) {
            return -1;
        }
        if (timeout > 0) {
            timeout = static_cast<int> (end - _clock.now_ms ());
            if (timeout <= 0) {
                errno = EAGAIN;
                return -1;
            }
        }
    }

    return 0;
}